

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void t1_builder_close_contour(T1_Builder builder)

{
  FT_Outline *pFVar1;
  int local_3c;
  FT_Byte *control;
  FT_Vector *p2;
  FT_Vector *p1;
  FT_Int first;
  FT_Outline *outline;
  T1_Builder builder_local;
  
  pFVar1 = builder->current;
  if (pFVar1 != (FT_Outline *)0x0) {
    if (pFVar1->n_contours < 2) {
      local_3c = 0;
    }
    else {
      local_3c = pFVar1->contours[pFVar1->n_contours + -2] + 1;
    }
    if ((pFVar1->n_contours == 0) || (local_3c != pFVar1->n_points)) {
      if (1 < pFVar1->n_points) {
        if (((pFVar1->points[local_3c].x == pFVar1->points[(long)(int)pFVar1->n_points + -1].x) &&
            (pFVar1->points[local_3c].y == pFVar1->points[(long)(int)pFVar1->n_points + -1].y)) &&
           (pFVar1->tags[(long)(int)pFVar1->n_points + -1] == '\x01')) {
          pFVar1->n_points = pFVar1->n_points + -1;
        }
      }
      if (0 < pFVar1->n_contours) {
        if (local_3c == pFVar1->n_points + -1) {
          pFVar1->n_contours = pFVar1->n_contours + -1;
          pFVar1->n_points = pFVar1->n_points + -1;
        }
        else {
          pFVar1->contours[pFVar1->n_contours + -1] = pFVar1->n_points + -1;
        }
      }
    }
    else {
      pFVar1->n_contours = pFVar1->n_contours + -1;
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_builder_close_contour( T1_Builder  builder )
  {
    FT_Outline*  outline = builder->current;
    FT_Int       first;


    if ( !outline )
      return;

    first = outline->n_contours <= 1
            ? 0 : outline->contours[outline->n_contours - 2] + 1;

    /* in malformed fonts it can happen that a contour was started */
    /* but no points were added                                    */
    if ( outline->n_contours && first == outline->n_points )
    {
      outline->n_contours--;
      return;
    }

    /* We must not include the last point in the path if it */
    /* is located on the first point.                       */
    if ( outline->n_points > 1 )
    {
      FT_Vector*  p1      = outline->points + first;
      FT_Vector*  p2      = outline->points + outline->n_points - 1;
      FT_Byte*    control = (FT_Byte*)outline->tags + outline->n_points - 1;


      /* `delete' last point only if it coincides with the first */
      /* point and it is not a control point (which can happen). */
      if ( p1->x == p2->x && p1->y == p2->y )
        if ( *control == FT_CURVE_TAG_ON )
          outline->n_points--;
    }

    if ( outline->n_contours > 0 )
    {
      /* Don't add contours only consisting of one point, i.e.,  */
      /* check whether the first and the last point is the same. */
      if ( first == outline->n_points - 1 )
      {
        outline->n_contours--;
        outline->n_points--;
      }
      else
        outline->contours[outline->n_contours - 1] =
          (short)( outline->n_points - 1 );
    }
  }